

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int absl::lts_20250127::anon_unknown_8::MapWeekday(weekday *wd)

{
  weekday *wd_local;
  
  switch(*wd) {
  case monday:
    wd_local._4_4_ = 1;
    break;
  case tuesday:
    wd_local._4_4_ = 2;
    break;
  case wednesday:
    wd_local._4_4_ = 3;
    break;
  case thursday:
    wd_local._4_4_ = 4;
    break;
  case friday:
    wd_local._4_4_ = 5;
    break;
  case saturday:
    wd_local._4_4_ = 6;
    break;
  case sunday:
    wd_local._4_4_ = 7;
    break;
  default:
    wd_local._4_4_ = 1;
  }
  return wd_local._4_4_;
}

Assistant:

inline int MapWeekday(const cctz::weekday& wd) {
  switch (wd) {
    case cctz::weekday::monday:
      return 1;
    case cctz::weekday::tuesday:
      return 2;
    case cctz::weekday::wednesday:
      return 3;
    case cctz::weekday::thursday:
      return 4;
    case cctz::weekday::friday:
      return 5;
    case cctz::weekday::saturday:
      return 6;
    case cctz::weekday::sunday:
      return 7;
  }
  return 1;
}